

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O2

void __thiscall HDual::major_chooseRow(HDual *this)

{
  double dVar1;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  uint uVar8;
  ulong in_RAX;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int *chIndex;
  double dVar17;
  double dVar18;
  undefined8 uStack_40;
  undefined8 uStack_38;
  int initialCount;
  double dVar2;
  
  if ((this->model->countUpdate == 0) || (this->multi_chooseAgain != 0)) {
    this->multi_chooseAgain = 0;
    this->multi_iteration = this->multi_iteration + 1;
    uStack_38 = in_RAX;
    do {
      while( true ) {
        uStack_38 = uStack_38 & 0xffffffff;
        lVar14 = -((ulong)(uint)this->multi_num * 4 + 0xf & 0xfffffffffffffff0);
        chIndex = (int *)((long)&uStack_38 + lVar14);
        iVar15 = this->multi_num;
        *(undefined8 *)((long)&uStack_40 + lVar14) = 0x12336c;
        HDualRHS::choose_multi_HGauto(&this->dualRHS,chIndex,(int *)((long)&uStack_38 + 4),iVar15);
        uVar8 = uStack_38._4_4_;
        dVar17 = (this->dualRHS).workCutoff;
        if (((uStack_38._4_4_ == 0) && (dVar17 == 0.0)) && (!NAN(dVar17))) {
          return;
        }
        pdVar3 = (this->dualRHS).workArray.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar4 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar11 = 0;
        uVar12 = 0;
        if (0 < (int)uStack_38._4_4_) {
          uVar12 = (ulong)uStack_38._4_4_;
        }
        uVar16 = 0;
        for (; iVar15 = (int)uVar16, uVar12 != uVar11; uVar11 = uVar11 + 1) {
          iVar9 = chIndex[uVar11];
          if (dVar17 <= pdVar3[iVar9] / pdVar4[iVar9]) {
            uVar16 = (ulong)(iVar15 + 1);
            chIndex[iVar15] = iVar9;
          }
        }
        *(undefined8 *)((long)&uStack_40 + lVar14) = 3;
        if ((uVar8 != 0) && ((int)uVar8 / (int)*(undefined8 *)((long)&uStack_40 + lVar14) < iVar15))
        break;
        dVar17 = this->columnDensity;
        *(undefined8 *)((long)&uStack_40 + lVar14) = 0x123424;
        HDualRHS::create_infeasList(&this->dualRHS,dVar17);
      }
      uVar11 = (ulong)(uint)this->multi_num;
      if (this->multi_num < 1) {
        uVar11 = 0;
      }
      for (lVar10 = 0; uVar11 * 0x260 - lVar10 != 0; lVar10 = lVar10 + 0x260) {
        *(undefined4 *)((long)&this->multi_choice[0].rowOut + lVar10) = 0xffffffff;
      }
      uVar11 = 0;
      if (0 < iVar15) {
        uVar11 = uVar16;
      }
      for (lVar10 = 0; uVar11 * 0x98 - lVar10 != 0; lVar10 = lVar10 + 0x98) {
        (&this->multi_choice[0].rowOut)[lVar10] = *chIndex;
        chIndex = chIndex + 1;
      }
      *(undefined8 *)((long)&uStack_40 + lVar14) = 0x123463;
      major_chooseRowBtran(this);
      dVar17 = this->row_epDensity;
      uVar11 = (ulong)(uint)this->multi_num;
      if (this->multi_num < 1) {
        uVar11 = 0;
      }
      for (lVar10 = 0; uVar11 * 0x260 - lVar10 != 0; lVar10 = lVar10 + 0x260) {
        if (-1 < *(int *)((long)&this->multi_choice[0].rowOut + lVar10)) {
          dVar17 = dVar17 * 0.95 +
                   ((double)*(int *)((long)&this->multi_choice[0].row_ep.count + lVar10) * 0.05) /
                   (double)this->numRow;
          this->row_epDensity = dVar17;
        }
      }
      pdVar3 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = 0;
      for (lVar10 = 0; uVar11 * 0x260 - lVar10 != 0; lVar10 = lVar10 + 0x260) {
        lVar13 = (long)*(int *)((long)&this->multi_choice[0].rowOut + lVar10);
        if ((-1 < lVar13) &&
           (dVar17 = *(double *)((long)&this->multi_choice[0].infeasEdWt + lVar10),
           dVar18 = dVar17 * 0.25, pdVar5 = pdVar3 + lVar13, dVar1 = *pdVar5, dVar2 = *pdVar5,
           pdVar3[lVar13] = dVar17, dVar2 <= dVar18 && dVar18 != dVar1)) {
          *(undefined4 *)((long)&this->multi_choice[0].rowOut + lVar10) = 0xffffffff;
          iVar9 = iVar9 + 1;
        }
      }
      *(undefined8 *)((long)&uStack_40 + lVar14) = 3;
    } while (iVar15 / (int)*(undefined8 *)((long)&uStack_40 + lVar14) < iVar9);
    pdVar5 = this->baseLower;
    dVar17 = this->model->dblOption[4];
    pdVar6 = this->baseValue;
    pdVar7 = this->baseUpper;
    pdVar3 = (this->dualRHS).workArray.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    uVar11 = (ulong)(uint)this->multi_num;
    if (this->multi_num < 1) {
      uVar11 = uVar12;
    }
    for (; uVar11 * 0x260 - uVar12 != 0; uVar12 = uVar12 + 0x260) {
      lVar14 = (long)*(int *)((long)&this->multi_choice[0].rowOut + uVar12);
      if (-1 < lVar14) {
        *(double *)((long)&this->multi_choice[0].baseValue + uVar12) = pdVar6[lVar14];
        *(double *)((long)&this->multi_choice[0].baseLower + uVar12) = pdVar5[lVar14];
        *(double *)((long)&this->multi_choice[0].baseUpper + uVar12) = pdVar7[lVar14];
        *(double *)((long)&this->multi_choice[0].infeasValue + uVar12) = pdVar3[lVar14];
        dVar1 = pdVar4[lVar14];
        *(double *)((long)&this->multi_choice[0].infeasEdWt + uVar12) = dVar1;
        *(double *)((long)&this->multi_choice[0].infeasLimit + uVar12) =
             (pdVar3[lVar14] / dVar1) * dVar17;
      }
    }
    this->multi_nFinish = 0;
  }
  return;
}

Assistant:

void HDual::major_chooseRow() {

    /**
     * 0. Initial check to see if we need to do it again
     */
    if (model->countUpdate == 0)
        multi_chooseAgain = 1;
    if (!multi_chooseAgain)
        return;
    multi_chooseAgain = 0;
    multi_iteration++;

    /**
     * Major loop:
     *     repeat 1-5, until we found a good sets of choices
     */
    for (;;) {
        // 1. Multiple CHUZR
        int initialCount = 0;
        int choiceIndex[multi_num];
        dualRHS.choose_multi_HGauto(&choiceIndex[0], &initialCount, multi_num);
//        dualRHS.choose_multi_global(&choiceIndex[0], &initialCount, multi_num);
        if (initialCount == 0 && dualRHS.workCutoff == 0) {
            // OPTIMAL
            return;
        }

        // 2. Shrink the size by cutoff
        int choiceCount = 0;
        for (int i = 0; i < initialCount; i++) {
            int iRow = choiceIndex[i];
            if (dualRHS.workArray[iRow] / dualRHS.workEdWt[iRow]
                    >= dualRHS.workCutoff) {
                choiceIndex[choiceCount++] = iRow;
            }
        }
        if (initialCount == 0 || choiceCount <= initialCount / 3) {
            // Need to do the list again
            dualRHS.create_infeasList(columnDensity);
            continue;
        }

        // 3. Store the choiceIndex to buffer
        for (int ich = 0; ich < multi_num; ich++)
            multi_choice[ich].rowOut = -1;
        for (int ich = 0; ich < choiceCount; ich++)
            multi_choice[ich].rowOut = choiceIndex[ich];

        // 4. Parallel BTRAN and compute weight
        major_chooseRowBtran();

        // 5. Update row weights
        for (int ich = 0; ich < multi_num; ich++) {
            if (multi_choice[ich].rowOut >= 0) {
                row_epDensity *= 0.95;
                row_epDensity += 0.05 * multi_choice[ich].row_ep.count / numRow;
            }
        }

        // 6. Check updated and computed weight
        int countWrongEdWt = 0;
        for (int i = 0; i < multi_num; i++) {
            const int iRow = multi_choice[i].rowOut;
            if (iRow < 0)
                continue;
            double u_weight = dualRHS.workEdWt[iRow];
            double c_weight = dualRHS.workEdWt[iRow] =
                    multi_choice[i].infeasEdWt;
            if (u_weight < 0.25 * c_weight) {
                multi_choice[i].rowOut = -1;
                countWrongEdWt++;
            }
        }
        if (countWrongEdWt <= choiceCount / 3)
            break;
    }

    // 6. Take other info associated with choices
    double pamiCutoff = model->dblOption[DBLOPT_PAMI_CUTOFF];
    for (int i = 0; i < multi_num; i++) {
        const int iRow = multi_choice[i].rowOut;
        if (iRow < 0)
            continue;
        // Other info
        multi_choice[i].baseValue = baseValue[iRow];
        multi_choice[i].baseLower = baseLower[iRow];
        multi_choice[i].baseUpper = baseUpper[iRow];
        multi_choice[i].infeasValue = dualRHS.workArray[iRow];
        multi_choice[i].infeasEdWt = dualRHS.workEdWt[iRow];
        multi_choice[i].infeasLimit = dualRHS.workArray[iRow]
                / dualRHS.workEdWt[iRow];
        multi_choice[i].infeasLimit *= pamiCutoff;
    }

    // 6. Finish count
    multi_nFinish = 0;
}